

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O0

void icu_63::BytesTrie::getNextBranchBytes(uint8_t *pos,int32_t length,ByteSink *out)

{
  uint8_t *pos_00;
  ByteSink *out_local;
  byte *pbStack_10;
  int32_t length_local;
  uint8_t *pos_local;
  
  out_local._4_4_ = length;
  pbStack_10 = pos;
  while (5 < out_local._4_4_) {
    pos_00 = jumpByDelta(pbStack_10 + 1);
    getNextBranchBytes(pos_00,out_local._4_4_ >> 1,out);
    out_local._4_4_ = out_local._4_4_ - (out_local._4_4_ >> 1);
    pbStack_10 = skipDelta(pbStack_10 + 1);
  }
  do {
    append(out,(uint)*pbStack_10);
    pbStack_10 = skipValue(pbStack_10 + 1);
    out_local._4_4_ = out_local._4_4_ + -1;
  } while (1 < out_local._4_4_);
  append(out,(uint)*pbStack_10);
  return;
}

Assistant:

void
BytesTrie::getNextBranchBytes(const uint8_t *pos, int32_t length, ByteSink &out) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison byte
        getNextBranchBytes(jumpByDelta(pos), length>>1, out);
        length=length-(length>>1);
        pos=skipDelta(pos);
    }
    do {
        append(out, *pos++);
        pos=skipValue(pos);
    } while(--length>1);
    append(out, *pos);
}